

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_material.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::random_internal::ReadSeedMaterialFromOSEntropy
          (random_internal *this,Span<unsigned_int> values)

{
  Span<unsigned_int> values_00;
  bool bVar1;
  pointer puVar2;
  undefined1 local_20 [8];
  Span<unsigned_int> values_local;
  
  values_local.ptr_ = values.ptr_;
  local_20 = (undefined1  [8])this;
  puVar2 = Span<unsigned_int>::data((Span<unsigned_int> *)local_20);
  if (puVar2 != (pointer)0x0) {
    puVar2 = Span<unsigned_int>::data((Span<unsigned_int> *)local_20);
    if (puVar2 == (pointer)0x0) {
      values_local.len_._7_1_ = false;
    }
    else {
      bVar1 = Span<unsigned_int>::empty((Span<unsigned_int> *)local_20);
      if (bVar1) {
        values_local.len_._7_1_ = true;
      }
      else {
        values_00.len_ = (size_type)values_local.ptr_;
        values_00.ptr_ = (pointer)local_20;
        values_local.len_._7_1_ = anon_unknown_2::ReadSeedMaterialFromOSEntropyImpl(values_00);
      }
    }
    return values_local.len_._7_1_;
  }
  __assert_fail("values.data() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/random/internal/seed_material.cc"
                ,0xce,
                "bool absl::random_internal::ReadSeedMaterialFromOSEntropy(absl::Span<uint32_t>)");
}

Assistant:

bool ReadSeedMaterialFromOSEntropy(absl::Span<uint32_t> values) {
  assert(values.data() != nullptr);
  if (values.data() == nullptr) {
    return false;
  }
  if (values.empty()) {
    return true;
  }
  return ReadSeedMaterialFromOSEntropyImpl(values);
}